

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O1

SegmentIdentificationHeader *
lrit::getHeader<lrit::SegmentIdentificationHeader>
          (SegmentIdentificationHeader *__return_storage_ptr__,Buffer *b,int pos)

{
  ushort uVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  puVar2 = (b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = *(ushort *)(puVar2 + (pos + 1));
  __return_storage_ptr__->headerType = puVar2[pos];
  auVar3._14_2_ = *(ushort *)(puVar2 + (pos + 0xf));
  auVar3._12_2_ = *(ushort *)(puVar2 + (pos + 0xd));
  auVar3._10_2_ = *(ushort *)(puVar2 + (pos + 0xb));
  auVar3._8_2_ = *(ushort *)(puVar2 + (pos + 9));
  auVar3._6_2_ = *(ushort *)(puVar2 + (pos + 7));
  auVar3._4_2_ = *(ushort *)(puVar2 + (pos + 5));
  auVar3._2_2_ = *(ushort *)(puVar2 + (pos + 3));
  auVar3._0_2_ = uVar1;
  auVar4._0_2_ = uVar1 >> 8;
  auVar4._2_2_ = *(ushort *)(puVar2 + (pos + 3)) >> 8;
  auVar4._4_2_ = *(ushort *)(puVar2 + (pos + 5)) >> 8;
  auVar4._6_2_ = *(ushort *)(puVar2 + (pos + 7)) >> 8;
  auVar4._8_2_ = *(ushort *)(puVar2 + (pos + 9)) >> 8;
  auVar4._10_2_ = *(ushort *)(puVar2 + (pos + 0xb)) >> 8;
  auVar4._12_2_ = *(ushort *)(puVar2 + (pos + 0xd)) >> 8;
  auVar4._14_2_ = *(ushort *)(puVar2 + (pos + 0xf)) >> 8;
  auVar3 = psllw(auVar3,8);
  auVar3 = auVar3 | auVar4;
  __return_storage_ptr__->headerLength = auVar3._0_2_;
  __return_storage_ptr__->imageIdentifier = auVar3._2_2_;
  __return_storage_ptr__->segmentNumber = auVar3._4_2_;
  __return_storage_ptr__->segmentStartColumn = auVar3._6_2_;
  __return_storage_ptr__->segmentStartLine = auVar3._8_2_;
  __return_storage_ptr__->maxSegment = auVar3._10_2_;
  __return_storage_ptr__->maxColumn = auVar3._12_2_;
  __return_storage_ptr__->maxLine = auVar3._14_2_;
  return __return_storage_ptr__;
}

Assistant:

SegmentIdentificationHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<SegmentIdentificationHeader>(b, pos);
  auto h = r.getHeader();
  r.read(&h.imageIdentifier);
  r.read(&h.segmentNumber);
  r.read(&h.segmentStartColumn);
  r.read(&h.segmentStartLine);
  r.read(&h.maxSegment);
  r.read(&h.maxColumn);
  r.read(&h.maxLine);
  return h;
}